

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Tags::Write(Tags *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  long lVar6;
  uint64 size;
  
  if (writer == (IMkvWriter *)0x0) {
    return false;
  }
  if (this->tags_count_ < 1) {
    size = 0;
  }
  else {
    lVar5 = 0;
    lVar6 = 0;
    size = 0;
    do {
      uVar4 = Tag::Write((Tag *)((long)&this->tags_->simple_tags_ + lVar5),(IMkvWriter *)0x0);
      size = size + uVar4;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < this->tags_count_);
  }
  bVar1 = WriteEbmlMasterElement(writer,0x1254c367,size);
  if (bVar1) {
    iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
    if (0 < this->tags_count_) {
      lVar6 = 0;
      lVar5 = 0;
      do {
        uVar4 = Tag::Write((Tag *)((long)&this->tags_->simple_tags_ + lVar6),writer);
        if (uVar4 == 0) goto LAB_0014fd83;
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar5 < this->tags_count_);
    }
    iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
    bVar1 = CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) == size ||
            CONCAT44(extraout_var_00,iVar3) < CONCAT44(extraout_var,iVar2);
  }
  else {
LAB_0014fd83:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Tags::Write(IMkvWriter* writer) const {
  if (writer == NULL)
    return false;

  uint64_t payload_size = 0;

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& tag = tags_[idx];
    payload_size += tag.Write(NULL);
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvTags, payload_size))
    return false;

  const int64_t start = writer->Position();

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& tag = tags_[idx];

    const uint64_t tag_size = tag.Write(writer);
    if (tag_size == 0)  // error
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != payload_size)
    return false;

  return true;
}